

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pit.c
# Opt level: O3

void ndn_pit_timeout(void *selfptr,size_t param_len,void *param)

{
  code *pcVar1;
  undefined8 uVar2;
  ulong uVar3;
  ndn_time_ms_t nVar4;
  nametree_entry_t *pnVar5;
  ulong uVar6;
  ndn_table_id_t *pnVar7;
  
  nVar4 = ndn_time_now_ms();
  if (*(short *)((long)selfptr + 8) != 0) {
    pnVar7 = (ndn_table_id_t *)((long)selfptr + 0x58);
    uVar6 = 0;
    do {
      if (*pnVar7 != 0xffff) {
        if ((*(long *)(pnVar7 + -0xc) != 0) &&
           (*(ulong *)(pnVar7 + -0x24) < nVar4 - *(long *)(pnVar7 + -0x10))) {
          pcVar1 = *(code **)(pnVar7 + -8);
          uVar2 = *(undefined8 *)(pnVar7 + -4);
          pnVar7[-0x18] = 0;
          pnVar7[-0x17] = 0;
          pnVar7[-0x16] = 0;
          pnVar7[-0x15] = 0;
          pnVar7[-8] = 0;
          pnVar7[-7] = 0;
          pnVar7[-6] = 0;
          pnVar7[-5] = 0;
          pnVar7[-4] = 0;
          pnVar7[-3] = 0;
          pnVar7[-2] = 0;
          pnVar7[-1] = 0;
          pnVar7[-0x10] = 0;
          pnVar7[-0xf] = 0;
          pnVar7[-0xe] = 0;
          pnVar7[-0xd] = 0;
          pnVar7[-0xc] = 0;
          pnVar7[-0xb] = 0;
          pnVar7[-10] = 0;
          pnVar7[-9] = 0;
          if (pcVar1 != (code *)0x0) {
            (*pcVar1)(uVar2);
          }
        }
        uVar3 = *(ulong *)(pnVar7 + -0x14);
        if ((*(ulong *)(pnVar7 + -0x14) <= nVar4 && nVar4 != uVar3) &&
           (*(ulong *)(pnVar7 + -0x24) < nVar4 - uVar3)) {
          pnVar5 = ndn_nametree_at(*selfptr,*pnVar7);
          pnVar5->pit_id = 0xffff;
          *pnVar7 = 0xffff;
          pnVar7[-0xc] = 0;
          pnVar7[-0xb] = 0;
          pnVar7[-10] = 0;
          pnVar7[-9] = 0;
          pnVar7[-8] = 0;
          pnVar7[-7] = 0;
          pnVar7[-6] = 0;
          pnVar7[-5] = 0;
          pnVar7[-0x14] = 0;
          pnVar7[-0x13] = 0;
          pnVar7[-0x12] = 0;
          pnVar7[-0x11] = 0;
          pnVar7[-0x10] = 0;
          pnVar7[-0xf] = 0;
          pnVar7[-0xe] = 0;
          pnVar7[-0xd] = 0;
          pnVar7[-0x1c] = 0;
          pnVar7[-0x1b] = 0;
          pnVar7[-0x1a] = 0;
          pnVar7[-0x19] = 0;
          pnVar7[-0x18] = 0;
          pnVar7[-0x17] = 0;
          pnVar7[-0x16] = 0;
          pnVar7[-0x15] = 0;
          pnVar7[-4] = 0;
          pnVar7[-3] = 0;
          pnVar7[-2] = 0;
          pnVar7[-1] = 0;
        }
      }
      uVar6 = uVar6 + 1;
      pnVar7 = pnVar7 + 0x28;
    } while (uVar6 < *(ushort *)((long)selfptr + 8));
  }
  ndn_msgqueue_post(selfptr,ndn_pit_timeout,0,(void *)0x0);
  return;
}

Assistant:

static void ndn_pit_timeout(void *selfptr, size_t param_len, void *param){
  ndn_pit_t* self = (ndn_pit_t*)selfptr;
  ndn_table_id_t i;
  ndn_time_ms_t now = ndn_time_now_ms();
  ndn_on_timeout_func on_timeout = NULL;
  void* userdata = NULL;

  for(i = 0; i < self->capacity; i ++){
    if(self->slots[i].nametree_id == NDN_INVALID_ID){
      continue;
    }

    // User timeout
    if(self->slots[i].on_data != NULL){
      if(now - self->slots[i].express_time > self->slots[i].options.lifetime){
        on_timeout = self->slots[i].on_timeout;
        userdata = self->slots[i].userdata;
        
        self->slots[i].on_timeout = NULL;
        self->slots[i].on_data = NULL;
        self->slots[i].userdata = NULL;
        self->slots[i].express_time = 0;
        self->slots[i].outgoing_faces = 0;

        if(on_timeout){
          on_timeout(userdata);
        }
      }
    }
    // PIT timeout
    if((now > self->slots[i].last_time) &&
       (now - self->slots[i].last_time > self->slots[i].options.lifetime))
    {
      ndn_pit_remove_entry(self, &self->slots[i]);
    }
  }

  ndn_msgqueue_post(self, ndn_pit_timeout, 0, NULL);
}